

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
::AssertHashEqConsistent<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
           *this,pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *key)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined1 *puVar3;
  ushort uVar4;
  ulong uVar5;
  undefined1 (*pauVar6) [16];
  uint uVar7;
  ulong uVar8;
  long lVar9;
  size_t hash_of_arg;
  uint64_t local_50;
  anon_class_24_3_2b146c49 local_48;
  
  if (1 < *(ulong *)(this + 8)) {
    local_50 = (uint64_t)
               hash_internal::HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
               combine<void_const*,std::basic_string_view<char,std::char_traits<char>>>
                         ((MixingHashState)&hash_internal::MixingHashState::kSeed,&key->first,
                          &key->second);
    uVar8 = *(ulong *)this;
    if (uVar8 < 0x11) {
      lVar9 = *(long *)(this + 0x18);
      local_48.hash_of_arg = &local_50;
      pauVar6 = *(undefined1 (**) [16])(this + 0x10);
      local_48.key = key;
      local_48.this =
           (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
            *)this;
      if (uVar8 < 0xf) {
        if (8 < uVar8) {
          __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x753,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                       );
        }
        uVar8 = *(ulong *)(*pauVar6 + uVar8) & 0x8080808080808080;
        if (uVar8 != 0x8080808080808080) {
          uVar8 = uVar8 ^ 0x8080808080808080;
          do {
            uVar5 = 0;
            if (uVar8 != 0) {
              for (; (uVar8 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            uVar5 = uVar5 >> 3 & 0x1fffffff;
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
            ::
            AssertHashEqConsistent<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::anon_class_24_3_2b146c49::operator()
                      (&local_48,pauVar6[-1] + uVar5 + 0xf,
                       (slot_type *)((ulong)(uint)((int)uVar5 << 5) + lVar9 + -0x20));
            uVar8 = uVar8 & uVar8 - 1;
          } while (uVar8 != 0);
        }
      }
      else {
        uVar8 = *(ulong *)(this + 8) >> 1;
        if (1 < *(ulong *)(this + 8)) {
          uVar5 = uVar8;
          while( true ) {
            auVar1 = *pauVar6;
            uVar7 = (uint)(ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar1[0xf] >> 7) << 0xf);
            if (uVar7 != 0xffff) {
              uVar7 = ~uVar7;
              do {
                uVar2 = 0;
                if (uVar7 != 0) {
                  for (; (uVar7 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
                  }
                }
                if ((char)(*pauVar6)[uVar2] < '\0') {
                  __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                ,0x764,
                                "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                               );
                }
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                ::
                AssertHashEqConsistent<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::anon_class_24_3_2b146c49::operator()
                          (&local_48,*pauVar6 + uVar2,(slot_type *)((ulong)(uVar2 << 5) + lVar9));
                uVar5 = uVar5 - 1;
                uVar4 = (ushort)(uVar7 - 1) & (ushort)uVar7;
                uVar7 = CONCAT22((short)(uVar7 - 1 >> 0x10),uVar4);
              } while (uVar4 != 0);
            }
            if (uVar5 == 0) break;
            lVar9 = lVar9 + 0x200;
            puVar3 = *pauVar6;
            pauVar6 = pauVar6 + 1;
            if (puVar3[0xf] == -1) {
              __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x76b,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                           );
            }
          }
        }
        if (uVar8 < *(ulong *)(this + 8) >> 1) {
          __assert_fail("original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x770,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::pair<const void *, std::basic_string_view<char>>, const google::protobuf::FieldDescriptor *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                       );
        }
      }
    }
  }
  return;
}

Assistant:

bool empty() const { return !size(); }